

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_collector.cpp
# Opt level: O2

bool __thiscall
skiwi::anon_unknown_2::quote_collector_visitor::_previsit(quote_collector_visitor *this,Quote *q)

{
  mapped_type *this_00;
  cell *c;
  stringstream str;
  key_type kStack_1b8;
  stringstream local_198 [16];
  skiwi local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,(ostream *)&q->arg,c);
  std::__cxx11::stringbuf::str();
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
            ::operator[](&this->collected_quotes,&kStack_1b8);
  cell::operator=(this_00,&q->arg);
  std::__cxx11::string::~string((string *)&kStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return true;
}

Assistant:

virtual bool _previsit(Quote& q)
      {
      std::stringstream str;
      str << q.arg;
      collected_quotes[str.str()] = q.arg;
      return true;
      }